

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorSum_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLchar *vector_name,GLuint size)

{
  ulong uVar1;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (size != 0) {
    uVar1 = 1;
    lVar2 = 0;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (uVar1 < size) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      lVar2 = lVar2 + 4;
      uVar1 = uVar1 + 1;
    } while ((ulong)size * 4 - lVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorSum(const GLchar* vector_name, GLuint size)
{
	static const GLchar* lut[] = {
		".x", ".y", ".z", ".w",
	};

	std::string sum;

	for (GLuint i = 0; i < size; ++i)
	{
		sum.append(vector_name);
		sum.append(lut[i]);

		if (i + 1 < size)
		{
			sum.append(" + ");
		}
	}

	return sum;
}